

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_mixer_chain.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  long lVar2;
  long lVar3;
  ALLEGRO_MIXER *pAVar4;
  ALLEGRO_SAMPLE *pAVar5;
  ALLEGRO_SAMPLE_INSTANCE *pAVar6;
  long lVar7;
  char *pcVar8;
  float fVar9;
  float fVar10;
  ALLEGRO_SAMPLE_INSTANCE *sample [2];
  ALLEGRO_MIXER *submixer [2];
  ALLEGRO_SAMPLE *sample_data [2];
  
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') goto LAB_001026b5;
  if (argc < 3) {
    log_printf("This example needs to be run from the command line.\nUsage: %s file1 file2\n",*argv)
    ;
    return 0;
  }
  al_init_acodec_addon();
  cVar1 = al_install_audio();
  if (cVar1 == '\0') {
    pcVar8 = "Could not init sound!\n";
  }
  else {
    lVar2 = al_create_voice(0xac44,1,0x20);
    if (lVar2 == 0) {
      pcVar8 = "Could not create ALLEGRO_VOICE.\n";
    }
    else {
      lVar3 = al_create_mixer(0xac44,3,0x20);
      pAVar4 = (ALLEGRO_MIXER *)al_create_mixer(0xac44,3,0x20);
      submixer[0] = pAVar4;
      submixer[1] = (ALLEGRO_MIXER *)al_create_mixer(0xac44,3,0x20);
      if (((lVar3 == 0) || (pAVar4 == (ALLEGRO_MIXER *)0x0)) ||
         (submixer[1] == (ALLEGRO_MIXER *)0x0)) {
        pcVar8 = "al_create_mixer failed.\n";
      }
      else {
        cVar1 = al_attach_mixer_to_voice(lVar3,lVar2);
        if (cVar1 == '\0') {
          pcVar8 = "al_attach_mixer_to_voice failed.\n";
        }
        else {
          lVar7 = 0;
          do {
            if (lVar7 == 2) {
              for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
                pAVar6 = sample[lVar7];
                al_set_sample_instance_playmode(pAVar6);
                al_play_sample_instance(pAVar6);
              }
              fVar9 = (float)al_get_sample_instance_time(sample[0]);
              fVar10 = (float)al_get_sample_instance_time(sample[1]);
              if (fVar10 <= fVar9) {
                fVar10 = fVar9;
              }
              log_printf("Playing...");
              al_rest();
              al_set_sample_instance_gain(0x3f000000,sample[0]);
              al_rest((double)fVar10);
              al_set_sample_instance_gain(0x3e800000,sample[1]);
              al_rest((double)fVar10);
              al_stop_sample_instance(sample[0]);
              al_stop_sample_instance(sample[1]);
              log_printf("Done\n");
              for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
                pAVar6 = sample[lVar7];
                al_set_sample(pAVar6,0);
                al_destroy_sample(sample_data[lVar7]);
                al_destroy_sample_instance(pAVar6);
                al_destroy_mixer(submixer[lVar7]);
              }
              al_destroy_mixer(lVar3);
              al_destroy_voice(lVar2);
              al_uninstall_audio();
              return 0;
            }
            pcVar8 = argv[lVar7 + 1];
            pAVar5 = (ALLEGRO_SAMPLE *)al_load_sample(pcVar8);
            sample_data[lVar7] = pAVar5;
            if (pAVar5 == (ALLEGRO_SAMPLE *)0x0) {
              abort_example("Could not load sample from \'%s\'!\n",pcVar8);
LAB_0010269e:
              pcVar8 = "al_create_sample failed.\n";
              goto LAB_001026ae;
            }
            pAVar6 = (ALLEGRO_SAMPLE_INSTANCE *)al_create_sample_instance(0);
            sample[lVar7] = pAVar6;
            if (pAVar6 == (ALLEGRO_SAMPLE_INSTANCE *)0x0) goto LAB_0010269e;
            cVar1 = al_set_sample(pAVar6,pAVar5);
            if (cVar1 == '\0') {
              pcVar8 = "al_set_sample_ptr failed.\n";
              goto LAB_001026ae;
            }
            pAVar4 = submixer[lVar7];
            cVar1 = al_attach_sample_instance_to_mixer(pAVar6,pAVar4);
            if (cVar1 == '\0') {
              pcVar8 = "al_attach_sample_instance_to_mixer failed.\n";
              goto LAB_001026ae;
            }
            cVar1 = al_attach_mixer_to_mixer(pAVar4);
            lVar7 = lVar7 + 1;
          } while (cVar1 != '\0');
          pcVar8 = "al_attach_mixer_to_mixer failed.\n";
        }
      }
    }
  }
LAB_001026ae:
  do {
    abort_example(pcVar8);
LAB_001026b5:
    pcVar8 = "Could not init Allegro.\n";
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_VOICE *voice;
   ALLEGRO_MIXER *mixer;
   ALLEGRO_MIXER *submixer[2];
   ALLEGRO_SAMPLE_INSTANCE *sample[2];
   ALLEGRO_SAMPLE *sample_data[2];
   float sample_time;
   float max_sample_time;
   int i;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   if (argc < 3) {
      log_printf("This example needs to be run from the command line.\nUsage: %s file1 file2\n", argv[0]);
      goto done;
   }

   al_init_acodec_addon();

   if (!al_install_audio()) {
      abort_example("Could not init sound!\n");
   }

   voice = al_create_voice(44100, ALLEGRO_AUDIO_DEPTH_INT16,
      ALLEGRO_CHANNEL_CONF_2);
   if (!voice) {
      abort_example("Could not create ALLEGRO_VOICE.\n");
   }

   mixer = al_create_mixer(44100, ALLEGRO_AUDIO_DEPTH_FLOAT32,
      ALLEGRO_CHANNEL_CONF_2);
   submixer[0] = al_create_mixer(44100, ALLEGRO_AUDIO_DEPTH_FLOAT32,
      ALLEGRO_CHANNEL_CONF_2);
   submixer[1] = al_create_mixer(44100, ALLEGRO_AUDIO_DEPTH_FLOAT32,
      ALLEGRO_CHANNEL_CONF_2);
   if (!mixer || !submixer[0] || !submixer[1]) {
      abort_example("al_create_mixer failed.\n");
   }

   if (!al_attach_mixer_to_voice(mixer, voice)) {
      abort_example("al_attach_mixer_to_voice failed.\n");
   }

   for (i = 0; i < 2; i++) {
      const char *filename = argv[i + 1];
      sample_data[i] = al_load_sample(filename);
      if (!sample_data[i]) {
         abort_example("Could not load sample from '%s'!\n", filename);
      }
      sample[i] = al_create_sample_instance(NULL);
      if (!sample[i]) {
         abort_example("al_create_sample failed.\n");
      }
      if (!al_set_sample(sample[i], sample_data[i])) {
         abort_example("al_set_sample_ptr failed.\n");
      }
      if (!al_attach_sample_instance_to_mixer(sample[i], submixer[i])) {
         abort_example("al_attach_sample_instance_to_mixer failed.\n");
      }
      if (!al_attach_mixer_to_mixer(submixer[i], mixer)) {
         abort_example("al_attach_mixer_to_mixer failed.\n");
      }
   }

   /* Play sample in looping mode. */
   for (i = 0; i < 2; i++) {
      al_set_sample_instance_playmode(sample[i], ALLEGRO_PLAYMODE_LOOP);
      al_play_sample_instance(sample[i]);
   }

   max_sample_time = al_get_sample_instance_time(sample[0]);
   sample_time = al_get_sample_instance_time(sample[1]);
   if (sample_time > max_sample_time)
      max_sample_time = sample_time;

   log_printf("Playing...");

   al_rest(max_sample_time);

   al_set_sample_instance_gain(sample[0], 0.5);
   al_rest(max_sample_time);

   al_set_sample_instance_gain(sample[1], 0.25);
   al_rest(max_sample_time);

   al_stop_sample_instance(sample[0]);
   al_stop_sample_instance(sample[1]);
   log_printf("Done\n");

   /* Free the memory allocated. */
   for (i = 0; i < 2; i++) {
      al_set_sample(sample[i], NULL);
      al_destroy_sample(sample_data[i]);
      al_destroy_sample_instance(sample[i]);
      al_destroy_mixer(submixer[i]);
   }
   al_destroy_mixer(mixer);
   al_destroy_voice(voice);

   al_uninstall_audio();

done:
   close_log(true);

   return 0;
}